

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeNdPoints.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
CreateRandomPoint(vector<float,_std::allocator<float>_> *__return_storage_ptr__,int N)

{
  iterator __position;
  uint uVar1;
  uint uVar2;
  float fVar3;
  undefined1 local_13c0 [8];
  random_device rd;
  default_random_engine generator;
  numType x;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::random_device::random_device((random_device *)local_13c0);
  uVar1 = std::random_device::_M_getval();
  uVar2 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  rd.field_0._4992_8_ = ZEXT48(uVar2 + uVar1 + (uint)(uVar1 + uVar2 == 0));
  if (0 < N) {
    do {
      fVar3 = std::
              generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         ((long)&rd.field_0 + 0x1380));
      generator._M_x._4_4_ = fVar3 * 10.0 + 0.0;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)__return_storage_ptr__,__position,
                   (float *)((long)&generator._M_x + 4));
      }
      else {
        *__position._M_current = generator._M_x._4_4_;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      N = N + -1;
    } while (N != 0);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

std::vector<numType> CreateRandomPoint(const int N)
{
	    numType x;
		std::vector<numType> point;
    
	    //uniformly generate points
	    std::random_device rd;
	    std::default_random_engine generator( rd() );
	    std::uniform_real_distribution< numType > uniform_distribution(0, 10);
    	
		for( auto i=0; i < N; i++)
		{
	        x = uniform_distribution( generator );
	        point.push_back( x );
	    }
		
		return point;
}